

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

pair<jsonip::holder,_const_jsonip::helper_*> __thiscall
jsonip::detail::stl_pushbackable_helper<std::vector<P,_std::allocator<P>_>_>::new_child
          (stl_pushbackable_helper<std::vector<P,_std::allocator<P>_>_> *this,holder *h)

{
  vector<P,_std::allocator<P>_> *this_00;
  pointer pPVar1;
  type *ptVar2;
  undefined8 *in_RDX;
  helper *extraout_RDX;
  pair<jsonip::holder,_const_jsonip::helper_*> pVar3;
  P local_20;
  
  this_00 = (vector<P,_std::allocator<P>_> *)*in_RDX;
  local_20.x = 0;
  local_20.y = 0;
  std::vector<P,_std::allocator<P>_>::emplace_back<P>(this_00,&local_20);
  pPVar1 = (this_00->super__Vector_base<P,_std::allocator<P>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  ptVar2 = calculate_helper<P>::instance();
  (this->super_helper)._vptr_helper = (_func_int **)(pPVar1 + -1);
  this[1].super_helper._vptr_helper = (_func_int **)ptVar2;
  pVar3.second = extraout_RDX;
  pVar3.first.t = this;
  return pVar3;
}

Assistant:

std::pair<holder, const helper*> new_child(holder &h) const
        {
            T& t = h.get<T>();
            t.push_back(value_type());
            return std::make_pair(holder(&t.back()), slice_helper::instance());
        }